

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_error.cpp
# Opt level: O0

Error * ot::commissioner::ErrorFromMbedtlsError(Error *__return_storage_ptr__,int aMbedtlsError)

{
  short sVar1;
  allocator local_149;
  string local_148;
  char local_128 [8];
  char mbedtlsErrorMsg [257];
  ErrorCode local_1c;
  uint16_t highLevelModuleId;
  ErrorCode errorCode;
  bool condition;
  int aMbedtlsError_local;
  
  if (0 < aMbedtlsError) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/mbedtls_error.cpp"
                  ,0x41,"Error ot::commissioner::ErrorFromMbedtlsError(int)");
  }
  sVar1 = (short)((int)(-aMbedtlsError & 0x7000U) >> 0xc);
  if (aMbedtlsError == 0) {
    local_1c = kNone;
  }
  else if ((((aMbedtlsError == -0x6900) || (aMbedtlsError == -0x6880)) || (aMbedtlsError == -0x6500)
           ) || (aMbedtlsError == -0x7000)) {
    local_1c = kIOBusy;
  }
  else if ((aMbedtlsError < -0x52) || (-0x42 < aMbedtlsError)) {
    if ((sVar1 == 6) || (sVar1 == 7)) {
      local_1c = kSecurity;
    }
    else {
      local_1c = kUnknown;
    }
  }
  else {
    local_1c = kIOError;
  }
  mbedtls_strerror(aMbedtlsError,local_128,0x101);
  if (local_1c == kNone) {
    Error::Error(__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,local_128,&local_149);
    Error::Error(__return_storage_ptr__,local_1c,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ErrorFromMbedtlsError(int aMbedtlsError)
{
    // See <mbedtls/error.h> for the constants.
    static constexpr int kMbedtlsErrorLowLevelNetBegin        = -0x0052;
    static constexpr int kMbedtlsErrorLowLevelNetEnd          = -0x0042;
    static constexpr int kMbedtlsErrorHighLevelModuleIdMask   = 0x7000;
    static constexpr int kMbedtlsErrorHighLevelModuleIdOffset = 12;
    static constexpr int kMbedtlsErrorHighLevelModuleIdCipher = 6;
    static constexpr int kMbedtlsErrorHighLevelModuleIdSsl    = 7;
    static constexpr int kMbedtlsErrorMsgMaxLength            = 256;

    ASSERT(aMbedtlsError <= 0);

    ErrorCode errorCode;

    uint16_t highLevelModuleId = (static_cast<uint16_t>(-aMbedtlsError) & kMbedtlsErrorHighLevelModuleIdMask) >>
                                 kMbedtlsErrorHighLevelModuleIdOffset;

    if (aMbedtlsError == 0)
    {
        errorCode = ErrorCode::kNone;
    }
    else if (aMbedtlsError == MBEDTLS_ERR_SSL_WANT_READ || aMbedtlsError == MBEDTLS_ERR_SSL_WANT_WRITE ||
             aMbedtlsError == MBEDTLS_ERR_SSL_ASYNC_IN_PROGRESS || aMbedtlsError == MBEDTLS_ERR_SSL_CRYPTO_IN_PROGRESS)
    {
        errorCode = ErrorCode::kIOBusy;
        ;
    }
    else if (aMbedtlsError >= kMbedtlsErrorLowLevelNetBegin && aMbedtlsError <= kMbedtlsErrorLowLevelNetEnd)
    {
        // Low-level NET error.
        errorCode = ErrorCode::kIOError;
    }
    else if (highLevelModuleId == kMbedtlsErrorHighLevelModuleIdCipher ||
             highLevelModuleId == kMbedtlsErrorHighLevelModuleIdSsl)
    {
        // High-level SSL or CIPHER error.
        errorCode = ErrorCode::kSecurity;
    }
    else
    {
        errorCode = ErrorCode::kUnknown;
    }

    char mbedtlsErrorMsg[kMbedtlsErrorMsgMaxLength + 1];
    mbedtls_strerror(aMbedtlsError, mbedtlsErrorMsg, sizeof(mbedtlsErrorMsg));

    return errorCode == ErrorCode::kNone ? ERROR_NONE : Error{errorCode, mbedtlsErrorMsg};
}